

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::generalizedGravityForces
          (KinDynComputations *this,Span<double,__1L> generalizedGravityForces)

{
  Span<double,__1L> vec;
  Span<double,__1L> vec_00;
  bool bVar1;
  Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
  *this_00;
  long lVar2;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RDI;
  bool ok;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffeb8;
  VectorDynSize *in_stack_fffffffffffffec8;
  extent_type<_1L> in_stack_fffffffffffffed0;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffed8;
  SpatialForceVector *in_stack_ffffffffffffff38;
  FreeFloatingGeneralizedTorques *in_stack_ffffffffffffff98;
  KinDynComputations *in_stack_ffffffffffffffa0;
  bool local_1;
  
  this_00 = (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
             *)Span<double,_-1L>::size((Span<double,__1L> *)0x1d1948);
  lVar2 = iDynTree::Model::getNrOfDOFs();
  if (this_00 ==
      (Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,__1,_1,_false>
       *)(lVar2 + 6)) {
    bVar1 = KinDynComputations::generalizedGravityForces
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (bVar1) {
      iDynTree::FreeFloatingGeneralizedTorques::baseWrench();
      toEigen(in_stack_ffffffffffffff38);
      vec.storage_.data_ = (pointer)in_stack_fffffffffffffed8;
      vec.storage_.super_extent_type<_1L>.size_ = in_stack_fffffffffffffed0.size_;
      toEigen(vec);
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::head<6>(in_stack_fffffffffffffeb8,(Index)this_00);
      Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,6,1,false>::
      operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_6,_1,_false>
                 *)this_00,in_RDI);
      iDynTree::FreeFloatingGeneralizedTorques::jointTorques();
      toEigen(in_stack_fffffffffffffec8);
      vec_00.storage_.data_ = (pointer)in_stack_fffffffffffffed8;
      vec_00.storage_.super_extent_type<_1L>.size_ = in_stack_fffffffffffffed0.size_;
      toEigen(vec_00);
      iDynTree::Model::getNrOfDOFs();
      Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::tail<unsigned_long>(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0.size_);
      Eigen::Block<Eigen::Map<Eigen::Matrix<double,-1,1,0,-1,1>,0,Eigen::Stride<0,0>>,-1,1,false>::
      operator=(this_00,(DenseBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                         *)in_RDI);
      local_1 = true;
    }
    else {
      iDynTree::reportError
                ("KinDynComputations","generalizedGravityForces","Unable to compute the bias forces"
                );
      local_1 = false;
    }
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","generalizedGravityForces",
               "Wrong size in input generalizedBiasForces");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool KinDynComputations::generalizedGravityForces(Span<double> generalizedGravityForces)
{
    bool ok = generalizedGravityForces.size() == pimpl->m_robot_model.getNrOfDOFs() + 6;

    if( !ok )
    {
        reportError("KinDynComputations","generalizedGravityForces","Wrong size in input generalizedBiasForces");
        return false;
    }

    ok = this->generalizedGravityForces(pimpl->m_generalizedForcesContainer);

    if( !ok )
    {
        reportError("KinDynComputations","generalizedGravityForces","Unable to compute the bias forces");
        return false;
    }

    toEigen(generalizedGravityForces).head<6>() = toEigen(pimpl->m_generalizedForcesContainer.baseWrench());
    toEigen(generalizedGravityForces).tail(pimpl->m_robot_model.getNrOfDOFs()) = toEigen(pimpl->m_generalizedForcesContainer.jointTorques());

    return true;
}